

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

void predict_or_learn_adaptive<false>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  reference pvVar2;
  int *tbs;
  EVP_PKEY_CTX *in_RDX;
  size_t *extraout_RDX;
  size_t *siglen;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *sig;
  int *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Da;
  int i;
  float stopping_point;
  float eta;
  float u;
  float v_partial_sum;
  float v_normalization;
  float s;
  float partial_prediction;
  float final_prediction;
  label_data *ld;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float local_24;
  
  local_24 = 0.0;
  uVar8 = 0;
  uVar7 = 0;
  fVar6 = 0.0;
  uVar5 = *(undefined4 *)(in_RDX + 0x6870);
  sig = in_RSI;
  fVar3 = sqrtf((float)in_RDI[0x1e]);
  fVar3 = 4.0 / fVar3;
  ctx = (EVP_PKEY_CTX *)(*(long *)(in_RDI + 10) + 0x3448);
  fVar4 = merand48((uint64_t *)CONCAT44(fVar3,in_stack_ffffffffffffffc0));
  local_44 = 0;
  siglen = extraout_RDX;
  while ((tbs = in_RDI, local_44 < *in_RDI &&
         (sig = in_RDX, ctx = in_RSI,
         LEARNER::learner<char,_example>::predict
                   ((learner<char,_example> *)CONCAT44(uVar8,uVar7),(example *)CONCAT44(fVar6,uVar5)
                    ,CONCAT44(fVar3,fVar4)), siglen = extraout_RDX_00, fVar6 <= fVar4))) {
    fVar1 = *(float *)(in_RDX + 0x6850);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x12),(long)local_44);
    local_24 = fVar1 * *pvVar2 + local_24;
    ctx = (EVP_PKEY_CTX *)(in_RDI + 0x18);
    sig = (EVP_PKEY_CTX *)(long)local_44;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)ctx,(size_type)sig);
    fVar6 = *pvVar2 + fVar6;
    local_44 = local_44 + 1;
    siglen = extraout_RDX_01;
  }
  *(undefined4 *)(in_RDX + 0x6870) = uVar5;
  *(float *)(in_RDX + 0x68a8) = local_24;
  sign(ctx,(uchar *)sig,siglen,(uchar *)tbs,in_R8);
  *(undefined4 *)(in_RDX + 0x6850) = extraout_XMM0_Da;
  if ((*(float *)(in_RDX + 0x6828) != *(float *)(in_RDX + 0x6850)) ||
     (NAN(*(float *)(in_RDX + 0x6828)) || NAN(*(float *)(in_RDX + 0x6850)))) {
    *(undefined4 *)(in_RDX + 0x68b0) = *(undefined4 *)(in_RDX + 0x6870);
  }
  else {
    *(undefined4 *)(in_RDX + 0x68b0) = 0;
  }
  return;
}

Assistant:

void predict_or_learn_adaptive(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0, partial_prediction = 0;

  float s = 0;
  float v_normalization = 0, v_partial_sum = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / (float)sqrtf((float)o.t);

  float stopping_point = merand48(o.all->random_state);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;

      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }

      partial_prediction += ec.pred.scalar * o.alpha[i];

      v_partial_sum += o.v[i];

      // update v, exp(-1) = 0.36788
      if (ld.label * partial_prediction < 0)
      {
        o.v[i] *= 0.36788f;
      }
      v_normalization += o.v[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }
      else
      {
        // stopping at learner i
        break;
      }
      v_partial_sum += o.v[i];
    }
  }

  // normalize v vector in training
  if (is_learn)
  {
    for (int i = 0; i < o.N; i++)
    {
      if (v_normalization)
        o.v[i] /= v_normalization;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}